

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageFuelReload.cpp
# Opt level: O0

bool __thiscall DIS::StorageFuelReload::operator==(StorageFuelReload *this,StorageFuelReload *rhs)

{
  bool local_19;
  bool ivarsEqual;
  StorageFuelReload *rhs_local;
  StorageFuelReload *this_local;
  
  local_19 = this->_maximumQuantity == rhs->_maximumQuantity &&
             this->_standardQuantity == rhs->_standardQuantity;
  if (this->_standardQuantityReloadTime != rhs->_standardQuantityReloadTime) {
    local_19 = false;
  }
  if (this->_maximumQuantityReloadTime != rhs->_maximumQuantityReloadTime) {
    local_19 = false;
  }
  if (this->_fuelMeasurementUnits != rhs->_fuelMeasurementUnits) {
    local_19 = false;
  }
  if (this->_fuelType != rhs->_fuelType) {
    local_19 = false;
  }
  if (this->_fuelLocation != rhs->_fuelLocation) {
    local_19 = false;
  }
  if (this->_padding != rhs->_padding) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool StorageFuelReload::operator ==(const StorageFuelReload& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_standardQuantity == rhs._standardQuantity) ) ivarsEqual = false;
     if( ! (_maximumQuantity == rhs._maximumQuantity) ) ivarsEqual = false;
     if( ! (_standardQuantityReloadTime == rhs._standardQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_maximumQuantityReloadTime == rhs._maximumQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_fuelMeasurementUnits == rhs._fuelMeasurementUnits) ) ivarsEqual = false;
     if( ! (_fuelType == rhs._fuelType) ) ivarsEqual = false;
     if( ! (_fuelLocation == rhs._fuelLocation) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }